

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O2

forward_list<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
 __thiscall
RenX::LadderDatabase::getPlayerEntriesAndIndexByPartName
          (LadderDatabase *this,string_view name,size_t max)

{
  size_t sVar1;
  char *pcVar2;
  long in_R8;
  Entry *itr;
  Entry *__args;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  size_t index;
  unsigned_long local_38;
  
  *(undefined8 *)this = 0;
  local_38 = 0;
  __args = *(Entry **)(name._M_len + 0x50);
  pcVar2 = (char *)max;
  if (in_R8 == 0) {
    for (; __args != (Entry *)0x0; __args = __args->next) {
      rhs_00._M_str = pcVar2;
      rhs_00._M_len = max;
      sVar1 = jessilib::findi<char,char>
                        ((jessilib *)&__args->most_recent_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         name._M_str,rhs_00);
      if (sVar1 != 0xffffffffffffffff) {
        std::
        forward_list<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
        ::emplace_front<RenX::LadderDatabase::Entry&,unsigned_long&>
                  ((forward_list<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
                    *)this,__args,&local_38);
      }
      local_38 = local_38 + 1;
    }
  }
  else {
    for (; __args != (Entry *)0x0; __args = __args->next) {
      rhs._M_str = pcVar2;
      rhs._M_len = max;
      sVar1 = jessilib::findi<char,char>
                        ((jessilib *)&__args->most_recent_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         name._M_str,rhs);
      if (sVar1 != 0xffffffffffffffff) {
        std::
        forward_list<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
        ::emplace_front<RenX::LadderDatabase::Entry&,unsigned_long&>
                  ((forward_list<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
                    *)this,__args,&local_38);
        if (in_R8 != 1) {
          return (_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
                  )(_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
                    )this;
        }
        in_R8 = 0;
      }
      local_38 = local_38 + 1;
    }
  }
  return (_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
          )(_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
            )this;
}

Assistant:

std::forward_list<std::pair<RenX::LadderDatabase::Entry, size_t>> RenX::LadderDatabase::getPlayerEntriesAndIndexByPartName(std::string_view name, size_t max) const {
	std::forward_list<std::pair<Entry, size_t>> list;
	size_t index = 0;
	if (max == 0)
	{
		for (Entry *itr = m_head; itr != nullptr; itr = itr->next, ++index) {
			if (jessilib::findi(itr->most_recent_name, name) != std::string::npos) {
				list.emplace_front(*itr, index);
			}
		}
	}
	else {
		for (Entry* itr = m_head; itr != nullptr; itr = itr->next, ++index) {
			if (jessilib::findi(itr->most_recent_name, name) != std::string::npos) {
				list.emplace_front(*itr, index);
				if (--max) {
					return list;
				}
			}
		}
	}
	return list;
}